

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_model_animation_array
rf_load_model_animations_from_iqm
          (uchar *data,int data_size,rf_allocator allocator,rf_allocator temp_allocator)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  rf_source_location rVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_vec3 v1;
  rf_vec3 v2;
  rf_vec3 v1_00;
  rf_vec3 v;
  rf_model_animation_array rVar8;
  undefined1 auVar9 [24];
  undefined1 auVar10 [24];
  undefined1 auVar11 [24];
  undefined1 auVar12 [24];
  int iVar13;
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  void *pvVar14;
  float *pfVar15;
  long lVar16;
  rf_allocator_proc *prVar17;
  long *in_FS_OFFSET;
  rf_quaternion q;
  rf_quaternion q2;
  rf_quaternion q_00;
  rf_vec3 rVar19;
  long local_308;
  rf_int i_1;
  rf_int frame_1;
  long local_2e8;
  rf_int i;
  rf_int frame;
  int dcounter;
  uint uStack_2bc;
  long local_2a0;
  rf_int j_1;
  rf_int j;
  uint uStack_27c;
  uint uStack_24c;
  long local_230;
  rf_int a;
  unsigned_short *framedata;
  uint uStack_1dc;
  rf_model_animation *animations;
  rf_iqm_anim *anim;
  rf_iqm_pose *poses;
  undefined4 uStack_12c;
  undefined4 uStack_f4;
  undefined8 local_d8;
  char temp_str [17];
  rf_iqm_header iqm;
  int data_size_local;
  uchar *data_local;
  rf_allocator temp_allocator_local;
  rf_allocator allocator_local;
  rf_model_animation_array result;
  rf_quaternion rVar18;
  
  temp_allocator_local.user_data = temp_allocator.allocator_proc;
  data_local = (uchar *)temp_allocator.user_data;
  prVar17 = allocator.allocator_proc;
  temp_allocator_local.allocator_proc = (rf_allocator_proc *)allocator.user_data;
  if ((data == (uchar *)0x0) || (data_size == 0)) {
    allocator_local.allocator_proc = (rf_allocator_proc *)0x0;
    result.size = 0;
  }
  else {
    memcpy(temp_str + 0x10,data,0x7c);
    iVar13 = strncmp(temp_str + 0x10,"INTERQUAKEMODEL",0x10);
    if (iVar13 == 0) {
      if (iqm.magic._8_4_ == 2) {
        __dest = (void *)(*(code *)temp_allocator_local.user_data)(&data_local,1);
        memcpy(__dest,data + iqm.ofs_joints,(ulong)iqm.num_joints * 0x58);
        __dest_00 = (void *)(*(code *)temp_allocator_local.user_data)(&data_local,1);
        memcpy(__dest_00,data + iqm.ofs_poses,(ulong)iqm.num_poses * 0x14);
        rVar4.proc_name = "rf_load_model_animations_from_iqm";
        rVar4.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar4.line_in_file = 0x8677;
        auVar9._8_8_ = (ulong)uStack_1dc << 0x20;
        auVar9._0_8_ = (ulong)iqm.num_poses << 5;
        auVar9._16_8_ = 0;
        result.size = (rf_int)(*prVar17)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar4,
                                         RF_AM_ALLOC,(rf_allocator_args)(auVar9 << 0x40));
        allocator_local.allocator_proc = (rf_allocator_proc *)(ulong)iqm.num_poses;
        __dest_01 = (void *)(*(code *)temp_allocator_local.user_data)(&data_local,1);
        memcpy(__dest_01,data + iqm.num_frames,(ulong)(iqm.num_anims * iqm.ofs_anims) << 1);
        for (local_230 = 0; local_230 < (long)(ulong)iqm.num_poses; local_230 = local_230 + 1) {
          *(ulong *)(result.size + local_230 * 0x20 + 0x10) =
               (ulong)*(uint *)((long)__dest_00 + local_230 * 0x14 + 8);
          *(ulong *)(result.size + local_230 * 0x20) = (ulong)iqm.num_joints;
          rVar5.proc_name = "rf_load_model_animations_from_iqm";
          rVar5.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar5.line_in_file = 0x8684;
          auVar10._8_8_ = (ulong)uStack_24c << 0x20;
          auVar10._0_8_ = (ulong)iqm.num_joints * 0x28;
          auVar10._16_8_ = 0;
          pvVar14 = (*prVar17)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar5,
                               RF_AM_ALLOC,(rf_allocator_args)(auVar10 << 0x40));
          *(void **)(result.size + local_230 * 0x20 + 8) = pvVar14;
          rVar6.proc_name = "rf_load_model_animations_from_iqm";
          rVar6.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar6.line_in_file = 0x8685;
          auVar11._8_8_ = (ulong)uStack_27c << 0x20;
          auVar11._0_8_ = (ulong)*(uint *)((long)__dest_00 + local_230 * 0x14 + 8) << 3;
          auVar11._16_8_ = 0;
          pvVar14 = (*prVar17)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar6,
                               RF_AM_ALLOC,(rf_allocator_args)(auVar11 << 0x40));
          *(void **)(result.size + local_230 * 0x20 + 0x18) = pvVar14;
          for (j_1 = 0; j_1 < (long)(ulong)iqm.num_joints; j_1 = j_1 + 1) {
            strcpy((char *)(*(long *)(result.size + local_230 * 0x20 + 8) + j_1 * 0x28),
                   "ANIMJOINTNAME");
            *(long *)(*(long *)(result.size + local_230 * 0x20 + 8) + j_1 * 0x28 + 0x20) =
                 (long)*(int *)((long)__dest + j_1 * 0x58);
          }
          for (local_2a0 = 0;
              local_2a0 < (long)(ulong)*(uint *)((long)__dest_00 + local_230 * 0x14 + 8);
              local_2a0 = local_2a0 + 1) {
            rVar7.proc_name = "rf_load_model_animations_from_iqm";
            rVar7.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar7.line_in_file = 0x8690;
            auVar12._8_8_ = (ulong)uStack_2bc << 0x20;
            auVar12._0_8_ = (ulong)iqm.num_joints * 0x28;
            auVar12._16_8_ = 0;
            pvVar14 = (*prVar17)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar7,
                                 RF_AM_ALLOC,(rf_allocator_args)(auVar12 << 0x40));
            *(void **)(*(long *)(result.size + local_230 * 0x20 + 0x18) + local_2a0 * 8) = pvVar14;
          }
          frame._4_4_ = *(int *)((long)__dest_00 + local_230 * 0x14 + 4) * iqm.ofs_anims;
          for (i = 0; i < (long)(ulong)*(uint *)((long)__dest_00 + local_230 * 0x14 + 8); i = i + 1)
          {
            for (local_2e8 = 0; local_2e8 < (long)(ulong)iqm.num_joints; local_2e8 = local_2e8 + 1)
            {
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
               local_2e8 * 0x28) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 8);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 1) != 0) {
                pfVar15 = (float *)(*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) +
                                             i * 8) + local_2e8 * 0x28);
                *pfVar15 = (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                           *(float *)((long)__dest + local_2e8 * 0x58 + 0x30) + *pfVar15;
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 4) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0xc);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 2) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 4) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x34) + *(float *)(lVar16 + 4);
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 8) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0x10);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 4) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 8) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x38) + *(float *)(lVar16 + 8);
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 0xc) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0x14);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 8) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 0xc) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x3c) + *(float *)(lVar16 + 0xc);
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 0x10) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0x18);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 0x10) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 0x10) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x40) + *(float *)(lVar16 + 0x10);
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 0x14) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0x1c);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 0x20) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 0x14) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x44) + *(float *)(lVar16 + 0x14);
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 0x18) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0x20);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 0x40) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 0x18) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x48) + *(float *)(lVar16 + 0x18);
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 0x1c) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0x24);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 0x80) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 0x1c) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x4c) + *(float *)(lVar16 + 0x1c);
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 0x20) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0x28);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 0x100) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 0x20) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x50) + *(float *)(lVar16 + 0x20);
                frame._4_4_ = frame._4_4_ + 1;
              }
              *(undefined4 *)
               (*(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                local_2e8 * 0x28 + 0x24) = *(undefined4 *)((long)__dest + local_2e8 * 0x58 + 0x2c);
              if ((*(uint *)((long)__dest + local_2e8 * 0x58 + 4) & 0x200) != 0) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8) +
                         local_2e8 * 0x28;
                *(float *)(lVar16 + 0x24) =
                     (float)*(ushort *)((long)__dest_01 + (long)frame._4_4_ * 2) *
                     *(float *)((long)__dest + local_2e8 * 0x58 + 0x54) + *(float *)(lVar16 + 0x24);
                frame._4_4_ = frame._4_4_ + 1;
              }
              lVar2 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i * 8);
              lVar16 = lVar2 + local_2e8 * 0x28;
              q._8_8_ = *(undefined8 *)(lVar2 + 0x14 + local_2e8 * 0x28);
              q._0_8_ = *(undefined8 *)(lVar2 + 0xc + local_2e8 * 0x28);
              rVar18 = rf_quaternion_normalize(q);
              *(long *)(lVar16 + 0xc) = rVar18._0_8_;
              *(long *)(lVar16 + 0x14) = rVar18._8_8_;
            }
          }
          for (i_1 = 0; i_1 < (long)(ulong)*(uint *)((long)__dest_00 + local_230 * 0x14 + 8);
              i_1 = i_1 + 1) {
            for (local_308 = 0; local_308 < *(long *)(result.size + local_230 * 0x20);
                local_308 = local_308 + 1) {
              if (-1 < *(long *)(*(long *)(result.size + local_230 * 0x20 + 8) + local_308 * 0x28 +
                                0x20)) {
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i_1 * 8);
                lVar3 = local_308 * 0x28;
                lVar2 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 8) + 0x20 + lVar3);
                rVar18._8_8_ = *(undefined8 *)(lVar16 + 0x14 + lVar2 * 0x28);
                rVar18._0_8_ = *(undefined8 *)(lVar16 + 0xc + lVar2 * 0x28);
                q2._8_8_ = *(undefined8 *)(lVar16 + 0x14 + lVar3);
                q2._0_8_ = *(undefined8 *)(lVar16 + 0xc + lVar3);
                rVar18 = rf_quaternion_mul(rVar18,q2);
                puVar1 = (undefined8 *)(lVar16 + 0xc + lVar3);
                *puVar1 = rVar18._0_8_;
                puVar1[1] = rVar18._8_8_;
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i_1 * 8);
                lVar3 = local_308 * 0x28;
                lVar2 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 8) + 0x20 + lVar3);
                v.z = *(float *)(lVar16 + 8 + lVar3);
                v._0_8_ = *(undefined8 *)(lVar16 + lVar3);
                q_00._8_8_ = *(undefined8 *)(lVar16 + 0x14 + lVar2 * 0x28);
                q_00._0_8_ = *(undefined8 *)(lVar16 + 0xc + lVar2 * 0x28);
                rVar19 = rf_vec3_rotate_by_quaternion(v,q_00);
                *(float *)(lVar16 + 8 + lVar3) = rVar19.z;
                *(long *)(lVar16 + lVar3) = rVar19._0_8_;
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i_1 * 8);
                lVar3 = local_308 * 0x28;
                lVar2 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 8) + 0x20 + lVar3);
                v1_00.z = *(float *)(lVar16 + 8 + lVar3);
                v1_00._0_8_ = *(undefined8 *)(lVar16 + lVar3);
                v2.z = *(float *)(lVar16 + 8 + lVar2 * 0x28);
                v2._0_8_ = *(undefined8 *)(lVar16 + lVar2 * 0x28);
                rVar19 = rf_vec3_add(v1_00,v2);
                *(float *)(lVar16 + 8 + lVar3) = rVar19.z;
                *(long *)(lVar16 + lVar3) = rVar19._0_8_;
                lVar16 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 0x18) + i_1 * 8);
                lVar3 = local_308 * 0x28;
                lVar2 = *(long *)(*(long *)(result.size + local_230 * 0x20 + 8) + 0x20 + lVar3);
                v1.z = *(float *)(lVar16 + 0x24 + lVar3);
                v1._0_8_ = *(undefined8 *)(lVar16 + 0x1c + lVar3);
                rVar19.z = *(float *)(lVar16 + 0x24 + lVar2 * 0x28);
                rVar19._0_8_ = *(undefined8 *)(lVar16 + 0x1c + lVar2 * 0x28);
                rVar19 = rf_vec3_mul_v(v1,rVar19);
                *(long *)(lVar16 + lVar3 + 0x1c) = rVar19._0_8_;
                *(float *)(lVar16 + lVar3 + 0x24) = rVar19.z;
              }
            }
          }
        }
        (*(code *)temp_allocator_local.user_data)(&data_local,3);
        (*(code *)temp_allocator_local.user_data)(&data_local,3);
        (*(code *)temp_allocator_local.user_data)(&data_local,3);
      }
      else {
        rf_log_impl(8,0x1b3622,(char *)0x5,(ulong)(uint)iqm.magic._8_4_);
        lVar16 = *in_FS_OFFSET;
        *(char **)(lVar16 + -0x460) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(lVar16 + -0x458) = "rf_load_model_animations_from_iqm";
        *(undefined8 *)(lVar16 + -0x450) = 0x8666;
        *(ulong *)(lVar16 + -0x448) = CONCAT44(uStack_12c,5);
        allocator_local.allocator_proc = (rf_allocator_proc *)0x0;
        result.size = 0;
      }
    }
    else {
      memset(&local_d8,0,0x11);
      local_d8 = stack0xffffffffffffff40;
      rf_log_impl(8,0x1b3601,(char *)0x5,&local_d8);
      lVar16 = *in_FS_OFFSET;
      *(char **)(lVar16 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar16 + -0x458) = "rf_load_model_animations_from_iqm";
      *(undefined8 *)(lVar16 + -0x450) = 0x865f;
      *(ulong *)(lVar16 + -0x448) = CONCAT44(uStack_f4,5);
      allocator_local.allocator_proc = (rf_allocator_proc *)0x0;
      result.size = 0;
    }
  }
  rVar8.anims = (rf_model_animation *)result.size;
  rVar8.size = (rf_int)allocator_local.allocator_proc;
  return rVar8;
}

Assistant:

RF_API rf_model_animation_array rf_load_model_animations_from_iqm(const unsigned char* data, int data_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    if (!data || !data_size) return (rf_model_animation_array) {0};

    #define RF_IQM_MAGIC "INTERQUAKEMODEL" // IQM file magic number
    #define RF_IQM_VERSION 2 // only IQM version 2 supported

    typedef struct rf_iqm_header rf_iqm_header;
    struct rf_iqm_header
    {
        char magic[16];
        unsigned int version;
        unsigned int filesize;
        unsigned int flags;
        unsigned int num_text, ofs_text;
        unsigned int num_meshes, ofs_meshes;
        unsigned int num_vertexarrays, num_vertexes, ofs_vertexarrays;
        unsigned int num_triangles, ofs_triangles, ofs_adjacency;
        unsigned int num_joints, ofs_joints;
        unsigned int num_poses, ofs_poses;
        unsigned int num_anims, ofs_anims;
        unsigned int num_frames, num_framechannels, ofs_frames, ofs_bounds;
        unsigned int num_comment, ofs_comment;
        unsigned int num_extensions, ofs_extensions;
    };

    typedef struct rf_iqm_pose rf_iqm_pose;
    struct rf_iqm_pose
    {
        int parent;
        unsigned int mask;
        float channeloffset[10];
        float channelscale[10];
    };

    typedef struct rf_iqm_anim rf_iqm_anim;
    struct rf_iqm_anim
    {
        unsigned int name;
        unsigned int first_frame, num_frames;
        float framerate;
        unsigned int flags;
    };

    rf_iqm_header iqm;

    // Read IQM header
    memcpy(&iqm, data, sizeof(rf_iqm_header));

    if (strncmp(iqm.magic, RF_IQM_MAGIC, sizeof(RF_IQM_MAGIC)))
    {
        char temp_str[sizeof(RF_IQM_MAGIC) + 1] = {0};
        memcpy(temp_str, iqm.magic, sizeof(RF_IQM_MAGIC));
        RF_LOG_ERROR(RF_BAD_FORMAT, "Magic Number \"%s\"does not match.", temp_str);

        return (rf_model_animation_array){0};
    }

    if (iqm.version != RF_IQM_VERSION)
    {
        RF_LOG_ERROR(RF_BAD_FORMAT, "IQM version %i is incorrect.", iqm.version);

        return (rf_model_animation_array){0};
    }

    rf_model_animation_array result = {
        .size = iqm.num_anims,
    };

    // Get bones data
    rf_iqm_pose* poses = (rf_iqm_pose*) RF_ALLOC(temp_allocator, iqm.num_poses * sizeof(rf_iqm_pose));
    memcpy(poses, data + iqm.ofs_poses, iqm.num_poses * sizeof(rf_iqm_pose));

    // Get animations data
    rf_iqm_anim* anim = (rf_iqm_anim*) RF_ALLOC(temp_allocator, iqm.num_anims * sizeof(rf_iqm_anim));
    memcpy(anim, data + iqm.ofs_anims, iqm.num_anims * sizeof(rf_iqm_anim));

    rf_model_animation* animations = (rf_model_animation*) RF_ALLOC(allocator, iqm.num_anims * sizeof(rf_model_animation));

    result.anims       = animations;
    result.size = iqm.num_anims;

    // frameposes
    unsigned short* framedata = (unsigned short*) RF_ALLOC(temp_allocator, iqm.num_frames * iqm.num_framechannels * sizeof(unsigned short));
    memcpy(framedata, data + iqm.ofs_frames, iqm.num_frames*iqm.num_framechannels * sizeof(unsigned short));

    for (rf_int a = 0; a < iqm.num_anims; a++)
    {
        animations[a].frame_count = anim[a].num_frames;
        animations[a].bone_count  = iqm.num_poses;
        animations[a].bones       = (rf_bone_info*) RF_ALLOC(allocator, iqm.num_poses * sizeof(rf_bone_info));
        animations[a].frame_poses = (rf_transform**) RF_ALLOC(allocator, anim[a].num_frames * sizeof(rf_transform*));
        //animations[a].framerate = anim.framerate;     // TODO: Use framerate?

        for (rf_int j = 0; j < iqm.num_poses; j++)
        {
            strcpy(animations[a].bones[j].name, "ANIMJOINTNAME");
            animations[a].bones[j].parent = poses[j].parent;
        }

        for (rf_int j = 0; j < anim[a].num_frames; j++)
        {
            animations[a].frame_poses[j] = (rf_transform*) RF_ALLOC(allocator, iqm.num_poses * sizeof(rf_transform));
        }

        int dcounter = anim[a].first_frame*iqm.num_framechannels;

        for (rf_int frame = 0; frame < anim[a].num_frames; frame++)
        {
            for (rf_int i = 0; i < iqm.num_poses; i++)
            {
                animations[a].frame_poses[frame][i].translation.x = poses[i].channeloffset[0];

                if (poses[i].mask & 0x01)
                {
                    animations[a].frame_poses[frame][i].translation.x += framedata[dcounter]*poses[i].channelscale[0];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].translation.y = poses[i].channeloffset[1];

                if (poses[i].mask & 0x02)
                {
                    animations[a].frame_poses[frame][i].translation.y += framedata[dcounter]*poses[i].channelscale[1];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].translation.z = poses[i].channeloffset[2];

                if (poses[i].mask & 0x04)
                {
                    animations[a].frame_poses[frame][i].translation.z += framedata[dcounter]*poses[i].channelscale[2];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.x = poses[i].channeloffset[3];

                if (poses[i].mask & 0x08)
                {
                    animations[a].frame_poses[frame][i].rotation.x += framedata[dcounter]*poses[i].channelscale[3];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.y = poses[i].channeloffset[4];

                if (poses[i].mask & 0x10)
                {
                    animations[a].frame_poses[frame][i].rotation.y += framedata[dcounter]*poses[i].channelscale[4];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.z = poses[i].channeloffset[5];

                if (poses[i].mask & 0x20)
                {
                    animations[a].frame_poses[frame][i].rotation.z += framedata[dcounter]*poses[i].channelscale[5];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.w = poses[i].channeloffset[6];

                if (poses[i].mask & 0x40)
                {
                    animations[a].frame_poses[frame][i].rotation.w += framedata[dcounter]*poses[i].channelscale[6];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.x = poses[i].channeloffset[7];

                if (poses[i].mask & 0x80)
                {
                    animations[a].frame_poses[frame][i].scale.x += framedata[dcounter]*poses[i].channelscale[7];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.y = poses[i].channeloffset[8];

                if (poses[i].mask & 0x100)
                {
                    animations[a].frame_poses[frame][i].scale.y += framedata[dcounter]*poses[i].channelscale[8];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.z = poses[i].channeloffset[9];

                if (poses[i].mask & 0x200)
                {
                    animations[a].frame_poses[frame][i].scale.z += framedata[dcounter]*poses[i].channelscale[9];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation = rf_quaternion_normalize(animations[a].frame_poses[frame][i].rotation);
            }
        }

        // Build frameposes
        for (rf_int frame = 0; frame < anim[a].num_frames; frame++)
        {
            for (rf_int i = 0; i < animations[a].bone_count; i++)
            {
                if (animations[a].bones[i].parent >= 0)
                {
                    animations[a].frame_poses[frame][i].rotation    = rf_quaternion_mul(animations[a].frame_poses[frame][animations[a].bones[i].parent].rotation, animations[a].frame_poses[frame][i].rotation);
                    animations[a].frame_poses[frame][i].translation = rf_vec3_rotate_by_quaternion(animations[a].frame_poses[frame][i].translation, animations[a].frame_poses[frame][animations[a].bones[i].parent].rotation);
                    animations[a].frame_poses[frame][i].translation = rf_vec3_add(animations[a].frame_poses[frame][i].translation, animations[a].frame_poses[frame][animations[a].bones[i].parent].translation);
                    animations[a].frame_poses[frame][i].scale       = rf_vec3_mul_v(animations[a].frame_poses[frame][i].scale, animations[a].frame_poses[frame][animations[a].bones[i].parent].scale);
                }
            }
        }
    }

    RF_FREE(temp_allocator, framedata);
    RF_FREE(temp_allocator, poses);
    RF_FREE(temp_allocator, anim);

    return result;
}